

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  sqlite3 *db;
  size_t __n;
  int iVar4;
  ushort uVar5;
  u8 *puVar6;
  sqlite3 **ppsVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Mem *pMVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  u8 *puVar15;
  int iVar16;
  int nArg;
  int local_3c;
  Parse *local_38;
  
  db = p->db;
  sVar1 = pParse->nVar;
  iVar12 = (int)sVar1;
  iVar3 = pParse->nTab;
  local_3c = pParse->nMaxArg;
  iVar8 = pParse->nMem + iVar3;
  iVar8 = (uint)(0 < iVar8 && (long)iVar3 == 0) + iVar8;
  iVar16 = p->nOp;
  puVar6 = &p->aOp->opcode + iVar16 * 0x18;
  iVar13 = pParse->szOpAlloc;
  resolveP2Values(p,&local_3c);
  iVar4 = local_3c;
  if (pParse->isMultiWrite == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)(pParse->mayAbort != '\0') << 6;
  }
  uVar14 = iVar13 + iVar16 * -0x18 & 0xfffffff8;
  uVar2 = *(ushort *)&p->field_0xc1;
  *(ushort *)&p->field_0xc1 = uVar5 | uVar2 & 0xffbf;
  iVar16 = 10;
  if (10 < iVar8) {
    iVar16 = iVar8;
  }
  if (pParse->explain == '\0') {
    iVar16 = iVar8;
  }
  *(ushort *)&p->field_0xc1 = uVar5 | uVar2 & 0xffbe;
  __n = (long)iVar3 << 3;
  iVar13 = local_3c * 8;
  local_38 = pParse;
  do {
    pMVar11 = p->aMem;
    if (pMVar11 == (Mem *)0x0) {
      uVar9 = uVar14 + iVar16 * -0x38;
      if ((int)uVar14 < iVar16 * 0x38) {
        pMVar11 = (Mem *)0x0;
        uVar9 = uVar14;
        uVar14 = iVar16 * 0x38;
      }
      else {
        pMVar11 = (Mem *)(puVar6 + (int)uVar9);
        uVar14 = 0;
      }
    }
    else {
      uVar9 = uVar14;
      uVar14 = 0;
    }
    p->aMem = pMVar11;
    pMVar11 = p->aVar;
    if (pMVar11 == (Mem *)0x0) {
      uVar10 = uVar9 + iVar12 * -0x38;
      if ((int)uVar9 < iVar12 * 0x38) {
        uVar14 = uVar14 + iVar12 * 0x38;
        pMVar11 = (Mem *)0x0;
      }
      else {
        pMVar11 = (Mem *)(puVar6 + (int)uVar10);
        uVar9 = uVar10;
      }
    }
    p->aVar = pMVar11;
    puVar15 = (u8 *)p->apArg;
    if (puVar15 == (u8 *)0x0) {
      uVar10 = uVar9 + iVar4 * -8;
      if ((int)uVar9 < iVar13) {
        uVar14 = uVar14 + iVar13;
        puVar15 = (u8 *)0x0;
      }
      else {
        puVar15 = puVar6 + (int)uVar10;
        uVar9 = uVar10;
      }
    }
    p->apArg = (Mem **)puVar15;
    puVar15 = (u8 *)p->apCsr;
    if (puVar15 == (u8 *)0x0) {
      iVar8 = (int)__n;
      if ((int)uVar9 < iVar8) {
        uVar14 = uVar14 + iVar8;
        puVar15 = (u8 *)0x0;
      }
      else {
        puVar15 = puVar6 + (int)(uVar9 - iVar8);
      }
    }
    p->apCsr = (VdbeCursor **)puVar15;
    if (uVar14 == 0) break;
    puVar6 = (u8 *)sqlite3DbMallocRawNN(db,(long)(int)uVar14);
    p->pFree = puVar6;
  } while (db->mallocFailed == '\0');
  p->pVList = local_38->pVList;
  local_38->pVList = (VList *)0x0;
  *(ushort *)&p->field_0xc1 = (*(ushort *)&p->field_0xc1 & 0xfff3) + (local_38->explain & 3) * 4;
  if (db->mallocFailed == '\0') {
    p->nCursor = iVar3;
    p->nVar = sVar1;
    if (0 < sVar1) {
      ppsVar7 = &p->aVar->db;
      uVar14 = iVar12 + 1;
      do {
        *ppsVar7 = db;
        *(u16 *)(ppsVar7 + -4) = 1;
        *(int *)(ppsVar7 + -1) = 0;
        ppsVar7 = ppsVar7 + 7;
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
    p->nMem = iVar16;
    if (0 < iVar16) {
      ppsVar7 = &p->aMem->db;
      uVar14 = iVar16 + 1;
      do {
        *ppsVar7 = db;
        *(u16 *)(ppsVar7 + -4) = 0x80;
        *(int *)(ppsVar7 + -1) = 0;
        ppsVar7 = ppsVar7 + 7;
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
    memset(p->apCsr,0,__n);
  }
  else {
    p->nVar = 0;
    p->nMem = 0;
    p->nCursor = 0;
  }
  p->magic = 0x2df20da3;
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->iStatement = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    x.nNeeded = 0;
    p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
    p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
    p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
    p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    if( x.nNeeded==0 ) break;
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
  }while( !db->mallocFailed );

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}